

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Option<const_Kernel::TermList_&> __thiscall
Lib::Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash>::tryGet
          (Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *this,PolyNf *key)

{
  ulong uVar1;
  bool bVar2;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict6
  RVar3;
  uint uVar4;
  uint *puVar5;
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  *in_RDX;
  uint *puVar6;
  uint uVar7;
  uint *puVar8;
  anon_class_16_2_d708292f f;
  anon_class_1_0_00000001 local_29;
  
  uVar7 = *(byte *)&(((PolyNfSuper *)&in_RDX->_inner)->_inner).
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          & 3;
  f.this = in_RDX;
  f.f = &local_29;
  RVar3 = CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ::
          switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      *)in_RDX,f);
  uVar7 = RVar3 + uVar7 * 0x40 + 0x9e3779b9 ^ uVar7;
  uVar7 = uVar7 + (uVar7 == 0);
  puVar5 = *(uint **)((key->super_PolyNfSuper)._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content + 7);
  puVar6 = (uint *)0x0;
  uVar1 = (ulong)uVar7 %
          (ulong)*(uint *)&(key->super_PolyNfSuper)._inner.
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           .
                           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ;
  uVar4 = puVar5[uVar1 * 10];
  if (uVar4 != 0) {
    puVar6 = puVar5 + uVar1 * 10;
    do {
      if (uVar4 == uVar7) {
        bVar2 = Kernel::operator==((PolyNf *)(puVar6 + 1),(PolyNf *)in_RDX);
        if (bVar2) {
          puVar6 = puVar6 + 8;
          goto LAB_00594cfc;
        }
        puVar5 = *(uint **)((key->super_PolyNfSuper)._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                            .
                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                            ._content + 7);
      }
      puVar8 = puVar6 + 10;
      puVar6 = puVar5;
      if (puVar8 != *(uint **)((key->super_PolyNfSuper)._inner.
                               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                               .
                               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                               ._content + 0xf)) {
        puVar6 = puVar8;
      }
      uVar4 = *puVar6;
    } while (uVar4 != 0);
    puVar6 = (uint *)0x0;
  }
LAB_00594cfc:
  *(uint **)this = puVar6;
  return (OptionBase<const_Kernel::TermList_&>)(OptionBase<const_Kernel::TermList_&>)this;
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }